

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_list_slots(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var1;
  uint uVar2;
  long lVar3;
  CK_RV CVar4;
  Tcl_Obj *pTVar5;
  char *pcVar6;
  long lVar7;
  Tcl_Obj *pTVar8;
  Tcl_Obj *pTVar9;
  Tcl_Obj *pTVar10;
  Tcl_Obj *pTVar11;
  Tcl_Obj *pTVar12;
  ulong uVar13;
  ProcErrorProc *pPVar14;
  CK_ULONG numSlots;
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *local_178;
  CK_TOKEN_INFO tokenInfo;
  CK_SLOT_INFO slotInfo;
  
  if (cd == (ClientData)0x0) {
    pPVar14 = tclStubsPtr->tcl_SetObjResult;
    pcVar6 = "invalid clientdata";
  }
  else if (objc == 2) {
    lVar3 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 0x18), lVar3 != 0)) {
      CVar4 = (**(code **)(*(long *)(lVar3 + 8) + 0x28))(0,0,&numSlots);
      if (CVar4 == 0) {
        pcVar6 = (*tclStubsPtr->tcl_Alloc)((int)numSlots << 3);
        CVar4 = (**(code **)(*(long *)(lVar3 + 8) + 0x28))(0,pcVar6,&numSlots);
        if (CVar4 == 0) {
          pTVar5 = (*tclStubsPtr->tcl_NewObj)();
          uVar13 = 0;
          do {
            if (CONCAT44(numSlots._4_4_,(int)numSlots) <= uVar13) {
              (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar5);
              return 0;
            }
            lVar7 = (**(code **)(*(long *)(lVar3 + 8) + 0x30))
                              (*(undefined8 *)(pcVar6 + uVar13 * 8),&slotInfo);
            pTVar8 = (*tclStubsPtr->tcl_NewObj)();
            p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
            pTVar9 = (*tclStubsPtr->tcl_NewLongObj)(*(long *)(pcVar6 + uVar13 * 8));
            (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar8,pTVar9);
            pTVar9 = (*tclStubsPtr->tcl_NewObj)();
            if (lVar7 == 0) {
              pTVar10 = (*tclStubsPtr->tcl_NewObj)();
              if (((byte)slotInfo.flags & 1) == 0) {
LAB_001025fe:
                pTVar12 = (Tcl_Obj *)0x0;
              }
              else {
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar12 = (*tclStubsPtr->tcl_NewStringObj)("TOKEN_PRESENT",-1);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar12);
                lVar7 = (**(code **)(*(long *)(lVar3 + 8) + 0x38))
                                  (*(undefined8 *)(pcVar6 + uVar13 * 8),&tokenInfo);
                if (lVar7 != 0) goto LAB_001025fe;
                pTVar12 = (*tclStubsPtr->tcl_NewStringObj)((char *)&tokenInfo,0x20);
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)((char *)&tokenInfo,0x20);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar10,pTVar11);
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)((char *)tokenInfo.manufacturerID,0x20);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar10,pTVar11);
                local_178 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)((char *)tokenInfo.model,0x10);
                (*local_178)((Tcl_Interp_conflict *)interp,pTVar10,pTVar11);
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)((char *)tokenInfo.serialNumber,0x10);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar10,pTVar11);
                if ((tokenInfo.flags & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("RNG",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                }
                if ((tokenInfo.flags & 2) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("WRITE_PROTECTED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                }
                if ((tokenInfo.flags & 4) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("LOGIN_REQUIRED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                }
                if ((tokenInfo.flags & 8) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_INITIALIZED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                }
                if ((tokenInfo.flags & 0x20) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("RESTORE_KEY_NOT_NEEDED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                }
                uVar2 = (uint)tokenInfo.flags;
                if ((tokenInfo.flags & 0x40) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("CLOCK_ON_TOKEN",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 8 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("PROTECTED_AUTHENTICATION_PATH",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 9 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("DUAL_CRYPTO_OPERATIONS",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 10 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("TOKEN_INITIALIZED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0xb & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("SECONDARY_AUTHENTICATION",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x10 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_COUNT_LOW",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x11 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_FINAL_TRY",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x12 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_LOCKED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x13 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("USER_PIN_TO_BE_CHANGED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x14 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_COUNT_LOW",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x15 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_FINAL_TRY",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x16 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_LOCKED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                  uVar2 = (uint)tokenInfo.flags;
                }
                if ((uVar2 >> 0x17 & 1) != 0) {
                  p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("SO_PIN_TO_BE_CHANGED",-1);
                  (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
                }
              }
              if (((byte)slotInfo.flags & 2) != 0) {
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("REMOVABLE_DEVICE",-1);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
              }
              if (((byte)slotInfo.flags & 4) != 0) {
                p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
                pTVar11 = (*tclStubsPtr->tcl_NewStringObj)("HW_SLOT",-1);
                (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar9,pTVar11);
              }
              p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
              if (pTVar12 == (Tcl_Obj *)0x0) {
                pTVar12 = (*tclStubsPtr->tcl_NewStringObj)((char *)&slotInfo,0x20);
              }
              (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar8,pTVar12);
              (*tclStubsPtr->tcl_ListObjAppendElement)((Tcl_Interp_conflict *)interp,pTVar8,pTVar9);
            }
            else {
              p_Var1 = tclStubsPtr->tcl_ListObjAppendElement;
              pTVar10 = (*tclStubsPtr->tcl_NewStringObj)(anon_var_dwarf_1b62 + 10,0);
              (*p_Var1)((Tcl_Interp_conflict *)interp,pTVar8,pTVar10);
              pTVar10 = pTVar9;
            }
            (*tclStubsPtr->tcl_ListObjAppendElement)((Tcl_Interp_conflict *)interp,pTVar8,pTVar10);
            (*tclStubsPtr->tcl_ListObjAppendElement)((Tcl_Interp_conflict *)interp,pTVar5,pTVar8);
            uVar13 = uVar13 + 1;
          } while( true );
        }
        pPVar14 = tclStubsPtr->tcl_SetObjResult;
        pTVar5 = tclpkcs11_pkcs11_error(CVar4);
      }
      else {
        pPVar14 = tclStubsPtr->tcl_SetObjResult;
        pTVar5 = tclpkcs11_pkcs11_error(CVar4);
      }
      goto LAB_0010245f;
    }
    pPVar14 = tclStubsPtr->tcl_SetObjResult;
    pcVar6 = "invalid handle";
  }
  else {
    pPVar14 = tclStubsPtr->tcl_SetObjResult;
    pcVar6 = "wrong # args: should be \"pki::pkcs11::listslots handle\"";
  }
  pTVar5 = (*tclStubsPtr->tcl_NewStringObj)(pcVar6,-1);
LAB_0010245f:
  (*pPVar14)((Tcl_Interp_conflict *)interp,pTVar5);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_list_slots(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle;
  Tcl_Obj *ret_list, *curr_item_list, *flags_list, *slot_desc, *token_desc;

  CK_SLOT_ID_PTR slots;
  CK_SLOT_INFO slotInfo;
  CK_TOKEN_INFO tokenInfo;
  CK_ULONG numSlots, currSlot;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 2) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::listslots handle\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_GetSlotList(FALSE, NULL, &numSlots);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  slots = (CK_SLOT_ID_PTR) ckalloc(sizeof(*slots) * numSlots);

  chk_rv = handle->pkcs11->C_GetSlotList(FALSE, slots, &numSlots);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  ret_list = Tcl_NewObj();

  for (currSlot = 0; currSlot < numSlots; currSlot++) {
    chk_rv = handle->pkcs11->C_GetSlotInfo(slots[currSlot], &slotInfo);

    curr_item_list = Tcl_NewObj();
    Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewLongObj(slots[currSlot]));

    flags_list = Tcl_NewObj();

    if (chk_rv != CKR_OK) {
      /* Add an empty string as the token label */
      Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj("", 0));

      /* Add the list of existing flags (none) */
      Tcl_ListObjAppendElement(interp, curr_item_list, flags_list);

      /* Add this item to the list */
      Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);

      continue;
    }

    slot_desc = NULL;
    token_desc = Tcl_NewObj();

    if ((slotInfo.flags & CKF_TOKEN_PRESENT) == CKF_TOKEN_PRESENT) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("TOKEN_PRESENT", -1));

      chk_rv = handle->pkcs11->C_GetTokenInfo(slots[currSlot], &tokenInfo);

      if (chk_rv == CKR_OK) {
        /* Add the token label as the slot label */
        if (!slot_desc) {
          slot_desc = Tcl_NewStringObj((const char *) tokenInfo.label, 32);
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.label, 32));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.manufacturerID, 32));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.model, 16));
          Tcl_ListObjAppendElement(interp, token_desc, Tcl_NewStringObj((const char *) tokenInfo.serialNumber, 16));
        }

        if ((tokenInfo.flags & CKF_RNG) == CKF_RNG) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("RNG", -1));
        }
        if ((tokenInfo.flags & CKF_WRITE_PROTECTED) == CKF_WRITE_PROTECTED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("WRITE_PROTECTED", -1));
        }
        if ((tokenInfo.flags & CKF_LOGIN_REQUIRED) == CKF_LOGIN_REQUIRED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("LOGIN_REQUIRED", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_INITIALIZED) == CKF_USER_PIN_INITIALIZED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_INITIALIZED", -1));
        }
        if ((tokenInfo.flags & CKF_RESTORE_KEY_NOT_NEEDED) == CKF_RESTORE_KEY_NOT_NEEDED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("RESTORE_KEY_NOT_NEEDED", -1));
        }
        if ((tokenInfo.flags & CKF_CLOCK_ON_TOKEN) == CKF_CLOCK_ON_TOKEN) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("CLOCK_ON_TOKEN", -1));
        }
        if ((tokenInfo.flags & CKF_PROTECTED_AUTHENTICATION_PATH) == CKF_PROTECTED_AUTHENTICATION_PATH) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("PROTECTED_AUTHENTICATION_PATH", -1));
        }
        if ((tokenInfo.flags & CKF_DUAL_CRYPTO_OPERATIONS) == CKF_DUAL_CRYPTO_OPERATIONS) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("DUAL_CRYPTO_OPERATIONS", -1));
        }
        if ((tokenInfo.flags & CKF_TOKEN_INITIALIZED) == CKF_TOKEN_INITIALIZED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("TOKEN_INITIALIZED", -1));
        }
        if ((tokenInfo.flags & CKF_SECONDARY_AUTHENTICATION) == CKF_SECONDARY_AUTHENTICATION) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SECONDARY_AUTHENTICATION", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_COUNT_LOW) == CKF_USER_PIN_COUNT_LOW) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_COUNT_LOW", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_FINAL_TRY) == CKF_USER_PIN_FINAL_TRY) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_FINAL_TRY", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_LOCKED) == CKF_USER_PIN_LOCKED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_LOCKED", -1));
        }
        if ((tokenInfo.flags & CKF_USER_PIN_TO_BE_CHANGED) == CKF_USER_PIN_TO_BE_CHANGED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("USER_PIN_TO_BE_CHANGED", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_COUNT_LOW) == CKF_SO_PIN_COUNT_LOW) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_COUNT_LOW", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_FINAL_TRY) == CKF_SO_PIN_FINAL_TRY) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_FINAL_TRY", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_LOCKED) == CKF_SO_PIN_LOCKED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_LOCKED", -1));
        }
        if ((tokenInfo.flags & CKF_SO_PIN_TO_BE_CHANGED) == CKF_SO_PIN_TO_BE_CHANGED) {
          Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("SO_PIN_TO_BE_CHANGED", -1));
        }
      }
    }

    /* Add additional slot flags */
    if ((slotInfo.flags & CKF_REMOVABLE_DEVICE) == CKF_REMOVABLE_DEVICE) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("REMOVABLE_DEVICE", -1));
    }
    if ((slotInfo.flags & CKF_HW_SLOT) == CKF_HW_SLOT) {
      Tcl_ListObjAppendElement(interp, flags_list, Tcl_NewStringObj("HW_SLOT", -1));
    }

    if (slot_desc) {
      /* If we found a more descriptive slot description, use it */
      Tcl_ListObjAppendElement(interp, curr_item_list, slot_desc);
    } else {
      /* Add the slot description as the label for tokens with nothing in them */
      Tcl_ListObjAppendElement(interp, curr_item_list, Tcl_NewStringObj((const char *) slotInfo.slotDescription, 32));
    }
    		
    Tcl_ListObjAppendElement(interp, curr_item_list, flags_list);

    /*Descryption token*/
    Tcl_ListObjAppendElement(interp, curr_item_list, token_desc);

    Tcl_ListObjAppendElement(interp, ret_list, curr_item_list);
  }

  Tcl_SetObjResult(interp, ret_list);

  return(TCL_OK);
}